

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_query.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
          (basic_resolver_query<asio::ip::tcp> *this,protocol_type *protocol,string *host,
          string *service,flags resolve_flags)

{
  int iVar1;
  tcp *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  in_RDI[1]._M_dataplus._M_p = (pointer)0x0;
  in_RDI[1]._M_string_length = 0;
  (in_RDI->field_2)._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI->field_2 + 8) = 0;
  (in_RDI->_M_dataplus)._M_p = (pointer)0x0;
  in_RDI->_M_string_length = 0;
  __str = in_RDI;
  std::__cxx11::string::string(unaff_retaddr,in_RDI);
  std::__cxx11::string::string(unaff_retaddr,__str);
  *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = in_R8D;
  iVar1 = tcp::family(in_RSI);
  *(int *)((long)&(in_RDI->_M_dataplus)._M_p + 4) = iVar1;
  iVar1 = tcp::type(in_RSI);
  *(int *)&in_RDI->_M_string_length = iVar1;
  iVar1 = tcp::protocol(in_RSI);
  *(int *)((long)&in_RDI->_M_string_length + 4) = iVar1;
  *(undefined4 *)&in_RDI->field_2 = 0;
  in_RDI[1]._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&in_RDI->field_2 + 8) = 0;
  in_RDI[1]._M_string_length = 0;
  return;
}

Assistant:

basic_resolver_query(const protocol_type& protocol,
      const std::string& host, const std::string& service,
      resolver_query_base::flags resolve_flags = address_configured)
    : hints_(),
      host_name_(host),
      service_name_(service)
  {
    hints_.ai_flags = static_cast<int>(resolve_flags);
    hints_.ai_family = protocol.family();
    hints_.ai_socktype = protocol.type();
    hints_.ai_protocol = protocol.protocol();
    hints_.ai_addrlen = 0;
    hints_.ai_canonname = 0;
    hints_.ai_addr = 0;
    hints_.ai_next = 0;
  }